

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O2

bool Diligent::VerifyDrawMeshIndirectAttribs
               (DrawMeshIndirectAttribs *Attribs,Uint32 IndirectCmdStride)

{
  IBuffer *pIVar1;
  IBuffer *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  char (*Args_1) [26];
  char (*in_RCX) [49];
  char (*in_R9) [53];
  char (*pacVar4) [7];
  string msg;
  Uint64 ReqCountBufSize;
  Uint64 ReqAttrBufSize;
  char (*Args_3) [53];
  undefined4 extraout_var_00;
  
  pIVar1 = Attribs->pAttribsBuffer;
  pIVar2 = Attribs->pCounterBuffer;
  if (pIVar1 == (IBuffer *)0x0) {
    FormatString<char[41],char[49]>
              (&msg,(Diligent *)"Draw mesh indirect attribs are invalid: ",
               (char (*) [41])"indirect draw arguments buffer must not be null.",in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyDrawMeshIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0xc2);
    std::__cxx11::string::~string((string *)&msg);
  }
  pacVar4 = (char (*) [7])0x3e75a5;
  iVar3 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar1);
  Args_3 = (char (*) [53])CONCAT44(extraout_var,iVar3);
  if (((*Args_3)[0x11] & 1U) == 0) {
    FormatString<char[41],char[33],char_const*,char[53]>
              (&msg,(Diligent *)"Draw mesh indirect attribs are invalid: ",(char (*) [41])0x65d9a3,
               (char (*) [33])Args_3,
               (char **)"\' was not created with BIND_INDIRECT_DRAW_ARGS flag.",in_R9);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyDrawMeshIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0xc6);
    pacVar4 = (char (*) [7])0x3e75f9;
    std::__cxx11::string::~string((string *)&msg);
  }
  ReqAttrBufSize = (ulong)Attribs->CommandCount * (ulong)IndirectCmdStride + Attribs->DrawArgsOffset
  ;
  if (*(ulong *)(*Args_3 + 8) < ReqAttrBufSize) {
    FormatString<char[41],char[25],unsigned_long,char[38],char_const*,char[25],unsigned_long,char[7]>
              (&msg,(Diligent *)"Draw mesh indirect attribs are invalid: ",
               (char (*) [41])"invalid DrawArgsOffset (",(char (*) [25])&Attribs->DrawArgsOffset,
               (unsigned_long *)") or indirect draw arguments buffer \'",(char (*) [38])Args_3,
               (char **)"\' size must be at least ",(char (*) [25])&ReqAttrBufSize,
               (unsigned_long *)0x65dabe,pacVar4);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyDrawMeshIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0xc9);
    std::__cxx11::string::~string((string *)&msg);
    in_R9 = Args_3;
  }
  if (pIVar2 != (IBuffer *)0x0) {
    pacVar4 = (char (*) [7])0x3e7692;
    iVar3 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar2);
    Args_1 = (char (*) [26])CONCAT44(extraout_var_00,iVar3);
    if (((*Args_1)[0x11] & 1U) == 0) {
      FormatString<char[41],char[26],char_const*,char[53]>
                (&msg,(Diligent *)"Draw mesh indirect attribs are invalid: ",
                 (char (*) [41])"indirect counter buffer \'",Args_1,
                 (char **)"\' was not created with BIND_INDIRECT_DRAW_ARGS flag.",in_R9);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyDrawMeshIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0xd0);
      pacVar4 = (char (*) [7])0x3e76e5;
      std::__cxx11::string::~string((string *)&msg);
    }
    ReqCountBufSize = Attribs->CounterOffset + 4;
    if (*(ulong *)(*Args_1 + 8) < ReqCountBufSize) {
      FormatString<char[41],char[24],unsigned_long,char[22],char_const*,char[25],unsigned_long,char[7]>
                (&msg,(Diligent *)"Draw mesh indirect attribs are invalid: ",
                 (char (*) [41])"invalid CounterOffset (",(char (*) [24])&Attribs->CounterOffset,
                 (unsigned_long *)") or counter buffer \'",(char (*) [22])Args_1,
                 (char **)"\' size must be at least ",(char (*) [25])&ReqCountBufSize,
                 (unsigned_long *)0x65dabe,pacVar4);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyDrawMeshIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0xd3);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return true;
}

Assistant:

bool VerifyDrawMeshIndirectAttribs(const DrawMeshIndirectAttribs& Attribs, Uint32 IndirectCmdStride)
{
    const IBuffer* pAttribsBuffer = Attribs.pAttribsBuffer;
    const IBuffer* pCounterBuffer = Attribs.pCounterBuffer;

#define CHECK_DRAW_MESH_INDIRECT_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Draw mesh indirect attribs are invalid: ", __VA_ARGS__)

    CHECK_DRAW_MESH_INDIRECT_ATTRIBS(pAttribsBuffer != nullptr, "indirect draw arguments buffer must not be null.");
    const BufferDesc& ArgsBuffDesc = pAttribsBuffer->GetDesc();
    CHECK_DRAW_MESH_INDIRECT_ATTRIBS((ArgsBuffDesc.BindFlags & BIND_INDIRECT_DRAW_ARGS) != 0,
                                     "indirect draw arguments buffer '", ArgsBuffDesc.Name,
                                     "' was not created with BIND_INDIRECT_DRAW_ARGS flag.");
    const Uint64 ReqAttrBufSize = Attribs.DrawArgsOffset + Uint64{IndirectCmdStride} * Uint64{Attribs.CommandCount};
    CHECK_DRAW_MESH_INDIRECT_ATTRIBS(ReqAttrBufSize <= ArgsBuffDesc.Size, "invalid DrawArgsOffset (", Attribs.DrawArgsOffset,
                                     ") or indirect draw arguments buffer '", ArgsBuffDesc.Name, "' size must be at least ", ReqAttrBufSize, " bytes");


    if (pCounterBuffer != nullptr)
    {
        const BufferDesc& CntBuffDesc = pCounterBuffer->GetDesc();
        CHECK_DRAW_MESH_INDIRECT_ATTRIBS((CntBuffDesc.BindFlags & BIND_INDIRECT_DRAW_ARGS) != 0, "indirect counter buffer '",
                                         CntBuffDesc.Name, "' was not created with BIND_INDIRECT_DRAW_ARGS flag.");
        const Uint64 ReqCountBufSize = Attribs.CounterOffset + sizeof(Uint32);
        CHECK_DRAW_MESH_INDIRECT_ATTRIBS(ReqCountBufSize <= CntBuffDesc.Size, "invalid CounterOffset (", Attribs.CounterOffset,
                                         ") or counter buffer '", CntBuffDesc.Name, "' size must be at least ", ReqCountBufSize, " bytes");
    }
#undef CHECK_DRAW_MESH_INDIRECT_ATTRIBS

    return true;
}